

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

void CVmObjString::parse_num_val(vm_val_t *retval,char *str,size_t len,int radix,int int_only)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  vm_obj_id_t vVar4;
  int in_ECX;
  long in_RDX;
  char *in_RSI;
  vm_val_t *in_RDI;
  int in_R8D;
  bool bVar5;
  bool bVar6;
  unsigned_long limit;
  int dig;
  size_t rem2;
  utf8_ptr p2;
  int promote;
  wchar_t ch;
  unsigned_long acc;
  int is_neg;
  size_t rem;
  utf8_ptr p;
  int in_stack_ffffffffffffff5c;
  size_t in_stack_ffffffffffffff60;
  size_t *in_stack_ffffffffffffff68;
  utf8_ptr *in_stack_ffffffffffffff70;
  uint local_7c;
  int local_5c;
  ulong local_40;
  utf8_ptr local_28;
  int local_20;
  int local_1c;
  long local_18;
  char *local_10;
  vm_val_t *local_8;
  
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  utf8_ptr::utf8_ptr(&local_28);
  utf8_ptr::set(&local_28,local_10);
  while( true ) {
    bVar5 = false;
    if (local_18 != 0) {
      utf8_ptr::getch((utf8_ptr *)0x33e058);
      iVar1 = t3_is_whitespace((wchar_t)(in_stack_ffffffffffffff60 >> 0x20));
      bVar5 = iVar1 != 0;
    }
    if (!bVar5) break;
    utf8_ptr::inc(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  bVar5 = false;
  if (local_18 != 0) {
    wVar2 = utf8_ptr::getch((utf8_ptr *)0x33e0a6);
    if (wVar2 == L'-') {
      bVar5 = true;
      utf8_ptr::inc(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    else {
      wVar2 = utf8_ptr::getch((utf8_ptr *)0x33e0d4);
      if (wVar2 == L'+') {
        utf8_ptr::inc(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
    }
  }
  while( true ) {
    bVar6 = false;
    if (local_18 != 0) {
      utf8_ptr::getch((utf8_ptr *)0x33e10c);
      iVar1 = t3_is_whitespace((wchar_t)(in_stack_ffffffffffffff60 >> 0x20));
      bVar6 = iVar1 != 0;
    }
    if (!bVar6) break;
    utf8_ptr::inc(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  local_40 = 0;
  while (local_18 != 0) {
    wVar2 = utf8_ptr::getch((utf8_ptr *)0x33e15f);
    if (((local_1c == 10) && (local_20 == 0)) &&
       ((wVar2 == L'.' || ((wVar2 == L'e' || (wVar2 == L'E')))))) {
      bVar6 = true;
      if ((wVar2 == L'e') || (wVar2 == L'E')) {
        utf8_ptr::inc(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        if ((local_18 != 0) &&
           ((wVar3 = utf8_ptr::getch((utf8_ptr *)0x33e1ea), wVar3 == L'+' ||
            (wVar3 = utf8_ptr::getch((utf8_ptr *)0x33e1f9), wVar3 == L'-')))) {
          utf8_ptr::inc(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        }
        bVar6 = false;
        if (local_18 != 0) {
          utf8_ptr::getch((utf8_ptr *)0x33e225);
          iVar1 = is_digit(L'\0');
          bVar6 = iVar1 != 0;
        }
      }
      if (bVar6) {
        vVar4 = CVmObjBigNum::create_radix
                          ((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           (char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           in_stack_ffffffffffffff5c);
        vm_val_t::set_obj(local_8,vVar4);
        return;
      }
    }
    if ((wVar2 < L'0') || (L'9' < wVar2)) {
      if ((wVar2 < L'a') || (L'z' < wVar2)) {
        if ((wVar2 < L'A') || (L'Z' < wVar2)) break;
        local_5c = wVar2 + L'\xffffffc9';
      }
      else {
        local_5c = wVar2 + L'\xffffffa9';
      }
    }
    else {
      local_5c = wVar2 + L'\xffffffd0';
    }
    if (local_1c <= local_5c) break;
    if ((bVar5) || (((local_1c != 2 && (local_1c != 8)) && (local_1c != 0x10)))) {
      local_7c = 0x7fffffff;
      if (bVar5) {
        local_7c = 0x80000000;
      }
    }
    else {
      local_7c = 0xffffffff;
    }
    if (((ulong)local_7c / (ulong)(long)local_1c < local_40) ||
       ((ulong)local_7c - (long)local_5c < (long)local_1c * local_40)) {
      if (local_20 == 0) {
        vVar4 = CVmObjBigNum::create_radix
                          ((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           (char *)in_stack_ffffffffffffff68,(size_t)local_8,
                           in_stack_ffffffffffffff5c);
        vm_val_t::set_obj(local_8,vVar4);
        return;
      }
      err_throw(0);
    }
    local_40 = (long)local_5c + (long)local_1c * local_40;
    utf8_ptr::inc(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  if ((bVar5) && (local_40 < 0x80000000)) {
    local_40 = -local_40;
  }
  vm_val_t::set_int(local_8,(int32_t)local_40);
  return;
}

Assistant:

void CVmObjString::parse_num_val(VMG_ vm_val_t *retval,
                                 const char *str, size_t len,
                                 int radix, int int_only)
{
    utf8_ptr p;
    size_t rem;

    /* skip leading spaces */
    for (p.set((char *)str), rem = len ;
         rem != 0 && t3_is_whitespace(p.getch()) ; p.inc(&rem)) ;
    
    /* presume it's positive */
    int is_neg = FALSE;
    
    /* check for a leading + or - */
    if (rem != 0)
    {
        if (p.getch() == '-')
        {
            /* note the sign and skip the character */
            is_neg = TRUE;
            p.inc(&rem);
        }
        else if (p.getch() == '+')
        {
            /* skip the character */
            p.inc(&rem);
        }
    }

    /* skip any additional spaces after the sign */
    for ( ; rem != 0 && t3_is_whitespace(p.getch()) ; p.inc(&rem)) ;
    
    /* clear the accumulator */
    unsigned long acc = 0;
    
    /* scan the digits */
    for ( ; rem != 0 ; p.inc(&rem))
    {
        /* get the next digit */
        wchar_t ch = p.getch();

        /* 
         *   If we're allowed to promote to BigNumber, and the radix is
         *   decimal, check for '.' and 'E' (for exponent) notation.  These
         *   could indicate a floating point value.  
         */
        if (radix == 10 && !int_only && (ch == '.' || ch == 'e' || ch == 'E'))
        {
            /* presume we're going to promote to BigNumber */
            int promote = TRUE;
            
            /* 
             *   If it's an exponent, parse further to make sure it looks
             *   like a valid exponent: we can have an optional + or - sign,
             *   then need at least one digit.  
             */
            if (ch == 'e' || ch == 'E')
            {
                /* set up a second pointer */
                utf8_ptr p2(p);
                size_t rem2 = rem;

                /* skip the 'e' */
                p2.inc(&rem);

                /* if there's a sign, skip it */
                if (rem2 != 0 && (p2.getch() == '+' || p2.getch() == '-'))
                    p2.inc(&rem2);

                /* we need a digit at this point, or it's not an exponent */
                promote = (rem2 != 0 && is_digit(p2.getch()));
            }

            /* if we're promoting after all, go do the promotion */
            if (promote)
            {
                /* re-parse it as a BigNumber value */
                retval->set_obj(CVmObjBigNum::create_radix(
                    vmg_ FALSE, str, len, radix));

                /* return this value */
                return;
            }
        }

        /* get the integer value of the digit, treating A-Z as digits 10-35 */
        int dig;
        if (ch >= '0' && ch <= '9')
            dig = (int)(ch - '0');
        else if (ch >= 'a' && ch <= 'z')
            dig = (int)(ch - 'a' + 10);
        else if (ch >= 'A' && ch <= 'Z')
            dig = (int)(ch - 'A' + 10);
        else
            break;

        /* if it's outside the radix limit, it's not a digit after all */
        if (dig >= radix)
            break;

        /* 
         *   Make sure we're not going to overflow.  If the base is 2, 8, or
         *   16, and there wasn't a "-" sign, allow the value to go up to the
         *   unsigned 32-bit limit, 0xffffffff.  Otherwise, limit it to
         *   32-bit signed, -0x8000000 to +0x7ffffff.  
         */
        unsigned long limit =
            (!is_neg && (radix == 2 || radix == 8 || radix == 16))
            ? 0xffffffff
            : is_neg ? 0x80000000 : 0x7fffffff;
        
        /* shift the accumulator by the radix, checking for overflow */
        if (acc > limit/radix)
            goto overflow;
        acc *= radix;

        /* add the digit, checking for overflow */
        if (acc > limit - dig)
            goto overflow;
        acc += dig;
    }
    
    /* apply the sign, if appropriate, and set the return value */
    retval->set_int(is_neg && acc <= 0x7FFFFFFF ? -(long)acc : (long)acc);
    return;

overflow:
    /*
     *   We overflowed the plain integer type.  If we're allowed to promote
     *   to a BigNumber, re-parse the value as a BigNumber.  If not, it's an
     *   error.
     */
    if (int_only)
    {
        /* we can't promote to BigNumber - throw an overflow error */
        err_throw(VMERR_NUM_OVERFLOW);
    }
    else
    {
        /* re-parse it as a BigNumber value */
        retval->set_obj(CVmObjBigNum::create_radix(
            vmg_ FALSE, str, len, radix));
    }
}